

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O3

bool __thiscall kj::CidrRange::matches(CidrRange *this,sockaddr *addr)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong __n;
  bool bVar4;
  
  if (this->family == 10) {
    lVar3 = 8;
    if (addr->sa_family == 10) goto LAB_0049fede;
LAB_0049ff27:
    bVar4 = false;
  }
  else {
    if (this->family != 2) {
      kj::_::unreachable();
    }
    if (addr->sa_family == 2) {
      lVar3 = 4;
    }
    else {
      if ((addr->sa_family != 10) ||
         (iVar2._0_2_ = addr[1].sa_family, iVar2._2_1_ = addr[1].sa_data[0],
         iVar2._3_1_ = addr[1].sa_data[1], iVar2 != -0x10000 || *(long *)(addr->sa_data + 6) != 0))
      goto LAB_0049ff27;
      lVar3 = 0x14;
    }
LAB_0049fede:
    uVar1 = this->bitCount;
    __n = (ulong)(uVar1 >> 3);
    if (7 < uVar1) {
      iVar2 = bcmp(this->bits,addr->sa_data + lVar3 + -2,__n);
      if (iVar2 != 0) goto LAB_0049ff27;
      if (uVar1 == 0x80) {
        return true;
      }
    }
    bVar4 = (0xff00U >> ((byte)uVar1 & 7) & (uint)(byte)(addr->sa_data + lVar3 + -2)[__n]) ==
            (uint)this->bits[__n];
  }
  return bVar4;
}

Assistant:

bool CidrRange::matches(const struct sockaddr* addr) const {
  const byte* otherBits;

  switch (family) {
    case AF_INET:
      if (addr->sa_family == AF_INET6) {
        otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
        static constexpr byte V6MAPPED[12] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0xff };
        if (arrayPtr(otherBits, sizeof(V6MAPPED)) == V6MAPPED) {
          // We're an ipv4 range and the address is ipv6, but it's a "v6 mapped" address, meaning
          // it's equivalent to an ipv4 address. Try to match against the ipv4 part.
          otherBits = otherBits + sizeof(V6MAPPED);
        } else {
          return false;
        }
      } else if (addr->sa_family == AF_INET) {
        otherBits = reinterpret_cast<const byte*>(
            &reinterpret_cast<const struct sockaddr_in*>(addr)->sin_addr.s_addr);
      } else {
        return false;
      }

      break;

    case AF_INET6:
      if (addr->sa_family != AF_INET6) return false;

      otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
      break;

    default:
      KJ_UNREACHABLE;
  }

  if (arrayPtr(bits).first(bitCount / 8) != arrayPtr(otherBits, bitCount / 8)) return false;

  return bitCount == 128 ||
      bits[bitCount / 8] == (otherBits[bitCount / 8] & (0xff00 >> (bitCount % 8)));
}